

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,secp256k1_ecdsa_signature *sig)

{
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  r.d[0] = *(uint64_t *)sig->data;
  r.d[1] = *(uint64_t *)(sig->data + 8);
  r.d[2] = *(uint64_t *)(sig->data + 0x10);
  r.d[3] = *(uint64_t *)(sig->data + 0x18);
  s.d[0] = *(uint64_t *)(sig->data + 0x20);
  s.d[1] = *(uint64_t *)(sig->data + 0x28);
  s.d[2] = *(uint64_t *)(sig->data + 0x30);
  s.d[3] = *(uint64_t *)(sig->data + 0x38);
  secp256k1_scalar_get_b32(output64,&r);
  secp256k1_scalar_get_b32(output64 + 0x20,&s);
  return 1;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}